

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pass.cpp
# Opt level: O2

Instruction * __thiscall
spvtools::opt::MemPass::GetPtr(MemPass *this,uint32_t ptrId,uint32_t *varId)

{
  uint32_t uVar1;
  DefUseManager *pDVar2;
  Instruction *this_00;
  Instruction *this_01;
  Op OVar3;
  
  *varId = ptrId;
  pDVar2 = Pass::get_def_use_mgr(&this->super_Pass);
  this_00 = analysis::DefUseManager::GetDef(pDVar2,*varId);
  OVar3 = this_00->opcode_;
  this_01 = this_00;
  if ((OVar3 != OpVariable) && (OVar3 != OpFunctionParameter)) {
    if (OVar3 == OpConstantNull) {
      *varId = 0;
      return this_00;
    }
    this_01 = Instruction::GetBaseAddress(this_00);
    OVar3 = this_01->opcode_;
  }
  uVar1 = 0;
  if (OVar3 == OpVariable) {
    uVar1 = Instruction::result_id(this_01);
  }
  *varId = uVar1;
  while (this_00->opcode_ == OpCopyObject) {
    uVar1 = Instruction::GetSingleWordInOperand(this_00,0);
    pDVar2 = Pass::get_def_use_mgr(&this->super_Pass);
    this_00 = analysis::DefUseManager::GetDef(pDVar2,uVar1);
  }
  return this_00;
}

Assistant:

Instruction* MemPass::GetPtr(uint32_t ptrId, uint32_t* varId) {
  *varId = ptrId;
  Instruction* ptrInst = get_def_use_mgr()->GetDef(*varId);
  Instruction* varInst;

  if (ptrInst->opcode() == spv::Op::OpConstantNull) {
    *varId = 0;
    return ptrInst;
  }

  if (ptrInst->opcode() != spv::Op::OpVariable &&
      ptrInst->opcode() != spv::Op::OpFunctionParameter) {
    varInst = ptrInst->GetBaseAddress();
  } else {
    varInst = ptrInst;
  }
  if (varInst->opcode() == spv::Op::OpVariable) {
    *varId = varInst->result_id();
  } else {
    *varId = 0;
  }

  while (ptrInst->opcode() == spv::Op::OpCopyObject) {
    uint32_t temp = ptrInst->GetSingleWordInOperand(0);
    ptrInst = get_def_use_mgr()->GetDef(temp);
  }

  return ptrInst;
}